

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O2

void __thiscall
ExampleNLFeeder::
WriteSparseVec<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>
          (ExampleNLFeeder *this,SingleSparseVecWrtFactory<int,_double> *gw,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  pointer ppVar1;
  pointer ppVar2;
  SparseVectorWriter<int,_double> gvw;
  
  mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
  SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
            ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8,(size_t)gw);
  ppVar1 = (vec->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (vec->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
    SparseVectorWriter<int,_double>::Write
              ((SparseVectorWriter<int,_double> *)&stack0xffffffffffffffd8,ppVar2->first,
               ppVar2->second);
  }
  return;
}

Assistant:

void WriteSparseVec(GradWriterFactory& gw, const SparseVec& vec) {
    auto gvw = gw.MakeVectorWriter(vec.size());
    for (auto v: vec)
      gvw.Write(v.first, v.second);
  }